

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPresolveAnalysis.cpp
# Opt level: O3

bool __thiscall HPresolveAnalysis::analysePresolveRuleLog(HPresolveAnalysis *this,bool report)

{
  pointer pHVar1;
  bool bVar2;
  long lVar3;
  char *format;
  uint uVar4;
  uint uVar5;
  HighsLogOptions *log_options_;
  long lVar6;
  string rule;
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  string local_50;
  
  bVar2 = true;
  if (this->allow_logging_ == true) {
    pHVar1 = (this->presolve_log_).rule.
             super__Vector_base<HighsPresolveRuleLog,_std::allocator<HighsPresolveRuleLog>_>._M_impl
             .super__Vector_impl_data._M_start;
    uVar4 = 0;
    lVar3 = 8;
    uVar5 = 0;
    do {
      uVar5 = uVar5 + *(int *)((long)&pHVar1->call + lVar3);
      uVar4 = uVar4 + *(int *)((long)pHVar1 + lVar3 + -4);
      lVar3 = lVar3 + 0xc;
    } while (lVar3 != 0xb0);
    log_options_ = &(this->options->super_HighsOptionsStruct).log_options;
    if ((report) && (uVar5 != -uVar4)) {
      local_70[0] = local_60;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_70,"-------------------------------------------------------","");
      highsLogDev(log_options_,kInfo,"%s\n",local_70[0]);
      highsLogDev(log_options_,kInfo,"%-25s      Rows      Cols     Calls\n","Presolve rule removed"
                 );
      highsLogDev(log_options_,kInfo,"%s\n",local_70[0]);
      lVar3 = 8;
      lVar6 = 0;
      do {
        pHVar1 = (this->presolve_log_).rule.
                 super__Vector_base<HighsPresolveRuleLog,_std::allocator<HighsPresolveRuleLog>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        if (((*(int *)((long)pHVar1 + lVar3 + -8) != 0) ||
            (*(int *)((long)&pHVar1->call + lVar3) != 0)) ||
           (*(int *)((long)pHVar1 + lVar3 + -4) != 0)) {
          utilPresolveRuleTypeToString_abi_cxx11_(&local_50,(HighsInt)lVar6);
          pHVar1 = (this->presolve_log_).rule.
                   super__Vector_base<HighsPresolveRuleLog,_std::allocator<HighsPresolveRuleLog>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          highsLogDev(log_options_,kInfo,"%-25s %9d %9d %9d\n",local_50._M_dataplus._M_p,
                      (ulong)*(uint *)((long)&pHVar1->call + lVar3),
                      (ulong)*(uint *)((long)pHVar1 + lVar3 + -4),
                      *(undefined4 *)((long)pHVar1 + lVar3 + -8));
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p);
          }
        }
        lVar6 = lVar6 + 1;
        lVar3 = lVar3 + 0xc;
      } while (lVar6 != 0xe);
      highsLogDev(log_options_,kInfo,"%s\n",local_70[0]);
      highsLogDev(log_options_,kInfo,"%-25s %9d %9d\n","Total reductions",(ulong)uVar5,(ulong)uVar4)
      ;
      highsLogDev(log_options_,kInfo,"%s\n",local_70[0]);
      highsLogDev(log_options_,kInfo,"%-25s %9d %9d\n","Original  model",
                  (ulong)(uint)this->original_num_row_,(ulong)(uint)this->original_num_col_);
      highsLogDev(log_options_,kInfo,"%-25s %9d %9d\n","Presolved model",
                  (ulong)(this->original_num_row_ - uVar5),(ulong)(this->original_num_col_ - uVar4))
      ;
      highsLogDev(log_options_,kInfo,"%s\n",local_70[0]);
      if (local_70[0] != local_60) {
        operator_delete(local_70[0]);
      }
    }
    bVar2 = true;
    if ((this->original_num_row_ == this->model->num_row_) &&
       (this->original_num_col_ == this->model->num_col_)) {
      if (uVar5 == *this->numDeletedRows) {
        if (uVar4 == *this->numDeletedCols) {
          return true;
        }
        format = "%d = sum_removed_col != numDeletedCols = %d\n";
        uVar5 = uVar4;
      }
      else {
        format = "%d = sum_removed_row != numDeletedRows = %d\n";
      }
      highsLogDev(log_options_,kError,format,(ulong)uVar5);
      fflush(_stdout);
      bVar2 = false;
    }
  }
  return bVar2;
}

Assistant:

bool HPresolveAnalysis::analysePresolveRuleLog(const bool report) {
  if (!allow_logging_) return true;
  const HighsLogOptions& log_options = options->log_options;
  HighsInt sum_removed_row = 0;
  HighsInt sum_removed_col = 0;
  for (HighsInt rule_type = kPresolveRuleMin; rule_type < kPresolveRuleCount;
       rule_type++) {
    sum_removed_row += presolve_log_.rule[rule_type].row_removed;
    sum_removed_col += presolve_log_.rule[rule_type].col_removed;
  }
  if (report && sum_removed_row + sum_removed_col) {
    const std::string rule =
        "-------------------------------------------------------";
    highsLogDev(log_options, HighsLogType::kInfo, "%s\n", rule.c_str());
    highsLogDev(log_options, HighsLogType::kInfo,
                "%-25s      Rows      Cols     Calls\n",
                "Presolve rule removed");
    highsLogDev(log_options, HighsLogType::kInfo, "%s\n", rule.c_str());
    for (HighsInt rule_type = kPresolveRuleMin; rule_type < kPresolveRuleCount;
         rule_type++)
      if (presolve_log_.rule[rule_type].call ||
          presolve_log_.rule[rule_type].row_removed ||
          presolve_log_.rule[rule_type].col_removed)
        highsLogDev(log_options, HighsLogType::kInfo, "%-25s %9d %9d %9d\n",
                    utilPresolveRuleTypeToString(rule_type).c_str(),
                    (int)presolve_log_.rule[rule_type].row_removed,
                    (int)presolve_log_.rule[rule_type].col_removed,
                    (int)presolve_log_.rule[rule_type].call);
    highsLogDev(log_options, HighsLogType::kInfo, "%s\n", rule.c_str());
    highsLogDev(log_options, HighsLogType::kInfo, "%-25s %9d %9d\n",
                "Total reductions", (int)sum_removed_row, (int)sum_removed_col);
    highsLogDev(log_options, HighsLogType::kInfo, "%s\n", rule.c_str());
    highsLogDev(log_options, HighsLogType::kInfo, "%-25s %9d %9d\n",
                "Original  model", (int)original_num_row_,
                (int)original_num_col_);
    highsLogDev(log_options, HighsLogType::kInfo, "%-25s %9d %9d\n",
                "Presolved model", (int)(original_num_row_ - sum_removed_row),
                (int)(original_num_col_ - sum_removed_col));
    highsLogDev(log_options, HighsLogType::kInfo, "%s\n", rule.c_str());
  }
  if (original_num_row_ == model->num_row_ &&
      original_num_col_ == model->num_col_) {
    if (sum_removed_row != *numDeletedRows) {
      highsLogDev(log_options, HighsLogType::kError,
                  "%d = sum_removed_row != numDeletedRows = %d\n",
                  (int)sum_removed_row, (int)*numDeletedRows);
      fflush(stdout);
      assert(sum_removed_row == *numDeletedRows);
      return false;
    }
    if (sum_removed_col != *numDeletedCols) {
      highsLogDev(log_options, HighsLogType::kError,
                  "%d = sum_removed_col != numDeletedCols = %d\n",
                  (int)sum_removed_col, (int)*numDeletedCols);
      fflush(stdout);
      assert(sum_removed_col == *numDeletedCols);
      return false;
    }
  }
  return true;
}